

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

void kratos::change_var_expr
               (shared_ptr<kratos::Expr> *expr,Var *target,Var *new_var,bool move_linked)

{
  undefined1 auVar1 [8];
  __normal_iterator<kratos::Var_**,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>
  _Var2;
  Expr *this;
  InternalException *this_00;
  ExprOp EVar3;
  Var *local_70;
  Var *cond;
  undefined1 local_60 [16];
  undefined1 local_50 [8];
  shared_ptr<kratos::VarConcat> concat;
  
  if ((target == (Var *)0x0) || (new_var == (Var *)0x0)) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_50 = (undefined1  [8])
               &concat.super___shared_ptr<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Variable is NULL","");
    InternalException::InternalException(this_00,(string *)local_50);
    __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  }
  this = (expr->super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (this->left->type_ == Expression) {
    Var::as<kratos::Expr>((Var *)local_50);
    change_var_expr((shared_ptr<kratos::Expr> *)local_50,target,new_var,move_linked);
    if (concat.super___shared_ptr<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 concat.super___shared_ptr<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    this = (expr->super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  if ((this->right != (Var *)0x0) && (this->right->type_ == Expression)) {
    Var::as<kratos::Expr>((Var *)local_50);
    change_var_expr((shared_ptr<kratos::Expr> *)local_50,target,new_var,move_linked);
    if (concat.super___shared_ptr<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 concat.super___shared_ptr<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    this = (expr->super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  if (this->left == target) {
    this->left = new_var;
    if (!move_linked) {
      if (this->right == target) {
        this->right = new_var;
      }
      goto LAB_001a5f9e;
    }
    (*(new_var->super_IRNode)._vptr_IRNode[0x14])(new_var,new_var);
    this = (expr->super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (this->right != target) goto LAB_001a5f9e;
    this->right = new_var;
  }
  else if ((this->right != target) || (this->right = new_var, !move_linked)) goto LAB_001a5f9e;
  (*(new_var->super_IRNode)._vptr_IRNode[0x14])(new_var,new_var);
  this = (expr->super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
LAB_001a5f9e:
  if (this->left->type_ == Slice) {
    set_slice_var_parent(&this->left,target,new_var,false);
    this = (expr->super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  if ((this->right != (Var *)0x0) && (this->right->type_ == Slice)) {
    set_slice_var_parent(&this->right,target,new_var,false);
    this = (expr->super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  EVar3 = this->op;
  if (EVar3 == Concat) {
    Var::as<kratos::VarConcat>((Var *)local_50);
    auVar1 = local_50;
    std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
              ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)local_60,
               (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
               &target->super_enable_shared_from_this<kratos::Var>);
    std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
              ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_70,
               (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
               &new_var->super_enable_shared_from_this<kratos::Var>);
    _Var2 = std::
            __find_if<__gnu_cxx::__normal_iterator<kratos::Var**,std::vector<kratos::Var*,std::allocator<kratos::Var*>>>,__gnu_cxx::__ops::_Iter_equals_val<kratos::Var*const>>
                      (*(_func_int **)((long)auVar1 + 0x288),
                       (_func_int *)
                       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)auVar1 + 0x290))->_M_allocated_capacity);
    if (_Var2._M_current !=
        (Var **)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)((long)auVar1 + 0x290))->_M_allocated_capacity) {
      *_Var2._M_current = local_70;
    }
    if (cond != (Var *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)cond);
    }
    if ((pointer)local_60._8_8_ != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
    }
    if (concat.super___shared_ptr<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 concat.super___shared_ptr<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    this = (expr->super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    EVar3 = this->op;
  }
  if (EVar3 == Conditional) {
    Var::as<kratos::ConditionalExpr>((Var *)local_50);
    local_70 = *(Var **)((long)local_50 + 0x288);
    if (local_70->type_ == Expression) {
      Var::as<kratos::Expr>((Var *)local_60);
      change_var_expr((shared_ptr<kratos::Expr> *)local_60,target,new_var,true);
      if ((pointer)local_60._8_8_ != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
      }
    }
    else if (local_70 == target) {
      *(Var **)((long)local_50 + 0x288) = new_var;
    }
    else if (local_70->type_ == Slice) {
      set_slice_var_parent(&local_70,target,new_var,false);
    }
    if (concat.super___shared_ptr<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 concat.super___shared_ptr<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    this = (expr->super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  Expr::set_parent(this);
  return;
}

Assistant:

void change_var_expr(const std::shared_ptr<Expr> &expr, Var *target, Var *new_var,
                     bool move_linked = true) {
    if (!new_var || !target) throw InternalException("Variable is NULL");
    if (expr->left->type() == VarType::Expression) {
        change_var_expr(expr->left->as<Expr>(), target, new_var, move_linked);
    }
    if (expr->right && expr->right->type() == VarType::Expression) {
        change_var_expr(expr->right->as<Expr>(), target, new_var, move_linked);
    }

    if (expr->left == target) {
        expr->left = new_var;
        if (move_linked) expr->left->move_linked_to(new_var);
    }
    if (expr->right && expr->right == target) {
        expr->right = new_var;
        if (move_linked) expr->right->move_linked_to(new_var);
    }

    // need to change the parent as well
    if (expr->left->type() == VarType::Slice) {
        set_slice_var_parent(expr->left, target, new_var, false);
    }
    if (expr->right && expr->right->type() == VarType::Slice) {
        set_slice_var_parent(expr->right, target, new_var, false);
    }
    // we did some tricks on the concatenation, need to update them there
    if (expr->op == ExprOp::Concat) {
        auto concat = expr->as<VarConcat>();
        concat->replace_var(target->shared_from_this(), new_var->shared_from_this());
    }
    // need to deal with ternary op as well
    if (expr->op == ExprOp::Conditional) {
        auto ternary = expr->as<ConditionalExpr>();
        auto *cond = ternary->condition;
        if (cond->type() == VarType::Expression) {
            change_var_expr(cond->as<Expr>(), target, new_var);
        } else if (cond == target) {
            ternary->condition = new_var;
        } else if (cond->type() == VarType::Slice) {
            set_slice_var_parent(cond, target, new_var, false);
        }
    }
    expr->set_parent();
}